

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ryg_dxt.cpp
# Opt level: O0

sU16 __thiscall ryg_dxt::Pixel::As16Bit(Pixel *this)

{
  sInt sVar1;
  sInt sVar2;
  sInt sVar3;
  Pixel *this_local;
  
  sVar1 = Mul8Bit((uint)(byte)this[2],0x1f);
  sVar2 = Mul8Bit((uint)(byte)this[1],0x3f);
  sVar3 = Mul8Bit((uint)(byte)*this,0x1f);
  return (short)sVar1 * 0x800 + (short)sVar2 * 0x20 + (short)sVar3;
}

Assistant:

sU16 As16Bit() const {
    return (Mul8Bit(r, 31) << 11) + (Mul8Bit(g, 63) << 5) + Mul8Bit(b, 31);
  }